

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

void nghttp2_frame_unpack_altsvc_payload
               (nghttp2_extension *frame,size_t origin_len,uint8_t *payload,size_t payloadlen)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)frame->payload;
  *puVar1 = payload;
  puVar1[1] = origin_len;
  puVar1[2] = payload + origin_len;
  puVar1[3] = payloadlen - origin_len;
  return;
}

Assistant:

void nghttp2_frame_unpack_altsvc_payload(nghttp2_extension *frame,
                                         size_t origin_len, uint8_t *payload,
                                         size_t payloadlen) {
  nghttp2_ext_altsvc *altsvc;
  uint8_t *p;

  altsvc = frame->payload;
  p = payload;

  altsvc->origin = p;

  p += origin_len;

  altsvc->origin_len = origin_len;

  altsvc->field_value = p;
  altsvc->field_value_len = (size_t)(payload + payloadlen - p);
}